

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::HostTransitionImageLayout
          (VulkanLogicalDevice *this,VkHostImageLayoutTransitionInfoEXT *TransitionInfo)

{
  VkResult VVar1;
  string msg;
  
  VVar1 = (*vkTransitionImageLayoutEXT)(this->m_VkDevice,1,TransitionInfo);
  if (VVar1 != VK_SUCCESS) {
    Diligent::FormatString<char[34]>(&msg,(char (*) [34])"Failed to transition image layout");
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"HostTransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2e9);
    std::__cxx11::string::~string((string *)&msg);
  }
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::HostTransitionImageLayout(const VkHostImageLayoutTransitionInfoEXT& TransitionInfo) const
{
#if DILIGENT_USE_VOLK
    VkResult err = vkTransitionImageLayoutEXT(m_VkDevice, 1, &TransitionInfo);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to transition image layout");
    return err;
#else
    UNSUPPORTED("Host image layout transition is not supported when vulkan library is linked statically");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}